

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long decode_packed_entry_number(codebook *book,oggpack_buffer *b)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint bits;
  uint bits_00;
  ulong uVar8;
  ulong uVar9;
  
  bits = book->dec_maxlength;
  lVar3 = oggpack_look(b,book->dec_firsttablen);
  if (lVar3 < 0) {
    lVar3 = book->used_entries;
    uVar9 = 0;
  }
  else {
    uVar2 = book->dec_firsttable[lVar3];
    if (-1 < (int)uVar2) {
      bits_00 = (uint)book->dec_codelengths[(ulong)uVar2 - 1];
      uVar6 = (ulong)uVar2 - 1;
      goto LAB_001d91e2;
    }
    uVar9 = (ulong)(uVar2 >> 0xf & 0x7fff);
    lVar3 = book->used_entries - (ulong)(uVar2 & 0x7fff);
  }
  lVar4 = oggpack_look(b,bits);
  uVar2 = bits;
  if ((int)bits < 2 || -1 < lVar4) {
    bVar5 = (byte)((ulong)lVar4 >> 0x3f);
  }
  else {
    do {
      bits = uVar2 - 1;
      lVar4 = oggpack_look(b,bits);
      bVar5 = (byte)((ulong)lVar4 >> 0x3f);
      if (-1 < lVar4) break;
      bVar1 = 2 < uVar2;
      uVar2 = bits;
    } while (bVar1);
  }
  if (bVar5 != 0) {
    return -1;
  }
  uVar6 = lVar3 - uVar9;
  if (1 < (long)uVar6) {
    uVar2 = (uint)lVar4;
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = (uVar2 & 0xf0f0f0f) << 4 | uVar2 >> 4 & 0xf0f0f0f;
    uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333) * 4;
    do {
      uVar6 = uVar6 >> 1;
      if ((uVar2 >> 1 & 0x55555555) + (uVar2 & 0x55555555) * 2 < book->codelist[uVar9 + uVar6]) {
        uVar8 = 0;
        uVar7 = uVar6;
      }
      else {
        uVar7 = 0;
        uVar8 = uVar6;
      }
      lVar3 = lVar3 - uVar7;
      uVar9 = uVar9 + uVar8;
      uVar6 = lVar3 - uVar9;
    } while (1 < (long)uVar6);
  }
  uVar2 = (uint)book->dec_codelengths[uVar9];
  bits_00 = uVar2;
  if ((int)bits < (int)uVar2) {
    bits_00 = bits;
  }
  uVar6 = 0xffffffffffffffff;
  if ((int)uVar2 <= (int)bits) {
    uVar6 = uVar9;
  }
LAB_001d91e2:
  oggpack_adv(b,bits_00);
  return uVar6;
}

Assistant:

STIN long decode_packed_entry_number(codebook *book, oggpack_buffer *b){
  int  read=book->dec_maxlength;
  long lo,hi;
  long lok = oggpack_look(b,book->dec_firsttablen);

  if (lok >= 0) {
    long entry = book->dec_firsttable[lok];
    if(entry&0x80000000UL){
      lo=(entry>>15)&0x7fff;
      hi=book->used_entries-(entry&0x7fff);
    }else{
      oggpack_adv(b, book->dec_codelengths[entry-1]);
      return(entry-1);
    }
  }else{
    lo=0;
    hi=book->used_entries;
  }

  /* Single entry codebooks use a firsttablen of 1 and a
     dec_maxlength of 1.  If a single-entry codebook gets here (due to
     failure to read one bit above), the next look attempt will also
     fail and we'll correctly kick out instead of trying to walk the
     underformed tree */

  lok = oggpack_look(b, read);

  while(lok<0 && read>1)
    lok = oggpack_look(b, --read);
  if(lok<0)return -1;

  /* bisect search for the codeword in the ordered list */
  {
    ogg_uint32_t testword=bitreverse((ogg_uint32_t)lok);

    while(hi-lo>1){
      long p=(hi-lo)>>1;
      long test=book->codelist[lo+p]>testword;
      lo+=p&(test-1);
      hi-=p&(-test);
      }

    if(book->dec_codelengths[lo]<=read){
      oggpack_adv(b, book->dec_codelengths[lo]);
      return(lo);
    }
  }

  oggpack_adv(b, read);

  return(-1);
}